

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O3

void __thiscall
Clasp::SingleOwnerPtr<Clasp::ExtDepGraph,_Clasp::DeleteObject>::reset
          (SingleOwnerPtr<Clasp::ExtDepGraph,_Clasp::DeleteObject> *this,ExtDepGraph *x)

{
  ExtDepGraph *this_00;
  
  this_00 = (ExtDepGraph *)(this->ptr_ & 0xfffffffffffffffe);
  if ((this->ptr_ & 1) != 0 && this_00 != x) {
    this->ptr_ = (uintp)this_00;
    if (this_00 != (ExtDepGraph *)0x0) {
      ExtDepGraph::~ExtDepGraph(this_00);
    }
    operator_delete(this_00);
  }
  this->ptr_ = (ulong)x | 1;
  return;
}

Assistant:

void reset(T* x)             {
		if (x != get() && is_owner()) { D deleter; deleter(release()); }
		ptr_ = set_bit(uintp(x),0);
	}